

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O3

void irr::executeBlit_TextureCopy_24_to_32(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar10 = job->width;
  uVar6 = (ulong)uVar10;
  uVar7 = job->height;
  pvVar4 = job->dst;
  if (job->stretch == true) {
    if (uVar7 != 0) {
      fVar1 = (float)job->x_stretch;
      fVar2 = (float)job->y_stretch;
      pvVar3 = job->src;
      uVar9 = 0;
      do {
        if (uVar10 != 0) {
          uVar11 = (int)(long)((float)uVar9 * fVar2) * job->srcPitch;
          uVar13 = 0;
          do {
            uVar14 = (long)((float)(uVar13 & 0xffffffff) * fVar1 * 3.0) & 0xffffffff;
            *(uint *)((long)pvVar4 + uVar13 * 4) =
                 (uint)*(byte *)((long)pvVar3 + uVar14 + (ulong)uVar11 + 2) |
                 (uint)*(byte *)((long)pvVar3 + uVar14 + (ulong)uVar11 + 1) << 8 |
                 (uint)*(byte *)((long)pvVar3 + uVar14 + uVar11) << 0x10 | 0xff000000;
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        pvVar4 = (void *)((long)pvVar4 + (ulong)job->dstPitch);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar7);
    }
  }
  else if (uVar7 != 0) {
    pbVar8 = (byte *)job->src;
    uVar10 = 0;
    do {
      iVar5 = (int)uVar6;
      uVar6 = 0;
      if (iVar5 != 0) {
        uVar13 = 0;
        pbVar12 = pbVar8;
        do {
          *(uint *)((long)pvVar4 + uVar13 * 4) =
               (uint)pbVar12[2] | (uint)pbVar12[1] << 8 | (uint)*pbVar12 << 0x10 | 0xff000000;
          pbVar12 = pbVar12 + 3;
          uVar13 = uVar13 + 1;
          uVar6 = (ulong)job->width;
        } while (uVar13 < uVar6);
        uVar7 = job->height;
      }
      pbVar8 = pbVar8 + job->srcPitch;
      pvVar4 = (void *)((long)pvVar4 + (ulong)job->dstPitch);
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar7);
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_32(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u32 *dst = static_cast<u32 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (const u8 *)job->src + (job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *s = src + (u32)(dx * wscale);
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
			}
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy < job->height; ++dy) {
			const u8 *s = src;

			for (u32 dx = 0; dx < job->width; ++dx) {
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}